

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.H
# Opt level: O1

char __thiscall Fl_Help_View::extend_selection(Fl_Help_View *this)

{
  int iVar1;
  int iVar2;
  Window WVar3;
  Fl_Surface_Device *pFVar4;
  Fl_Display_Device *pFVar5;
  
  WVar3 = fl_window;
  iVar2 = selection_last;
  iVar1 = selection_first;
  if (Fl::e_is_click != 0) {
    return '\0';
  }
  selected = 1;
  mouse_x = Fl::e_x;
  mouse_y = Fl::e_y;
  draw_mode = 2;
  fl_window = fl_help_view_buffer;
  pFVar4 = Fl_Surface_Device::_surface;
  if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
    pFVar4 = Fl_Surface_Device::default_surface();
  }
  pFVar5 = Fl_Display_Device::display_device();
  (*(pFVar5->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[2])(this);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_window = WVar3;
  (*(pFVar4->super_Fl_Device)._vptr_Fl_Device[3])(pFVar4);
  selection_first = selection_drag_first;
  if (selection_push_first < selection_drag_first) {
    selection_first = selection_push_first;
  }
  draw_mode = 0;
  selection_last = selection_drag_last;
  if (selection_drag_last < selection_push_last) {
    selection_last = selection_push_last;
  }
  return iVar2 != selection_last || iVar1 != selection_first;
}

Assistant:

static int event_is_click()	{return e_is_click;}